

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericInitListDefaults<capnproto_test::capnp::test::TestListDefaults::Builder>
               (Builder builder)

{
  initializer_list<capnp::Text::Reader> value;
  initializer_list<capnp::Text::Reader> value_00;
  initializer_list<capnp::Text::Reader> value_01;
  initializer_list<int> value_02;
  initializer_list<int> value_03;
  initializer_list<int> value_04;
  Builder local_888;
  Builder local_860;
  Builder local_838;
  Builder local_810;
  undefined1 local_7e8 [8];
  Builder e;
  Builder l_2;
  Reader RStack_788;
  StructDataBitCount *local_778;
  undefined8 local_770;
  Reader local_768;
  iterator local_758;
  undefined8 local_750;
  Reader local_748;
  Reader RStack_738;
  iterator local_728;
  undefined8 local_720;
  undefined1 local_718 [8];
  Builder l_1;
  int local_6d8 [2];
  iterator local_6d0;
  undefined8 local_6c8;
  int local_6bc [3];
  iterator local_6b0;
  undefined8 local_6a8;
  undefined1 local_6a0 [8];
  Builder l;
  Builder local_668;
  Builder local_640;
  ArrayPtr<const_char> local_618;
  Builder local_608;
  Builder local_5e0;
  Builder local_5b8;
  Builder local_590;
  Builder local_568;
  Builder local_540;
  Builder local_518;
  Builder local_4f0;
  Builder local_4c8;
  Builder local_4a0;
  Builder local_478;
  Builder local_450;
  Builder local_428;
  Builder local_400;
  Builder local_3d8;
  Builder local_3b0;
  Builder local_388;
  Builder local_360;
  Builder local_338;
  Builder local_310;
  Builder local_2e8;
  Builder local_2c0;
  Builder local_298;
  Builder local_270;
  Builder local_248;
  Builder local_220;
  Builder local_1f0;
  Builder local_1c8;
  Builder local_198;
  Builder local_170;
  Builder local_148;
  Builder local_120;
  Builder local_f8;
  Builder local_d0;
  Builder local_a8;
  Builder local_80;
  Builder local_58;
  undefined1 local_30 [8];
  Builder lists;
  
  capnproto_test::capnp::test::TestListDefaults::Builder::initLists
            ((Builder *)local_30,(Builder *)&stack0x00000008);
  capnproto_test::capnp::test::TestLists::Builder::initList0(&local_58,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::initList1(&local_80,(Builder *)local_30,4);
  capnproto_test::capnp::test::TestLists::Builder::initList8(&local_a8,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::initList16(&local_d0,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::initList32(&local_f8,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::initList64(&local_120,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::initListP(&local_148,(Builder *)local_30,2);
  capnproto_test::capnp::test::TestLists::Builder::getList0(&local_198,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::operator[]
            (&local_170,&local_198,0);
  capnproto_test::capnp::test::TestLists::Struct0::Builder::setF(&local_170);
  capnproto_test::capnp::test::TestLists::Builder::getList0(&local_1f0,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct0,_(capnp::Kind)3>::Builder::operator[]
            (&local_1c8,&local_1f0,1);
  capnproto_test::capnp::test::TestLists::Struct0::Builder::setF(&local_1c8);
  capnproto_test::capnp::test::TestLists::Builder::getList1(&local_248,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_220,&local_248,0);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_220,true);
  capnproto_test::capnp::test::TestLists::Builder::getList1(&local_298,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_270,&local_298,1);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_270,false);
  capnproto_test::capnp::test::TestLists::Builder::getList1(&local_2e8,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_2c0,&local_2e8,2);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_2c0,true);
  capnproto_test::capnp::test::TestLists::Builder::getList1(&local_338,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            (&local_310,&local_338,3);
  capnproto_test::capnp::test::TestLists::Struct1::Builder::setF(&local_310,true);
  capnproto_test::capnp::test::TestLists::Builder::getList8(&local_388,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            (&local_360,&local_388,0);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF(&local_360,'{');
  capnproto_test::capnp::test::TestLists::Builder::getList8(&local_3d8,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            (&local_3b0,&local_3d8,1);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF(&local_3b0,'-');
  capnproto_test::capnp::test::TestLists::Builder::getList16(&local_428,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
            (&local_400,&local_428,0);
  capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_400,0x3039);
  capnproto_test::capnp::test::TestLists::Builder::getList16(&local_478,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct16,_(capnp::Kind)3>::Builder::operator[]
            (&local_450,&local_478,1);
  capnproto_test::capnp::test::TestLists::Struct16::Builder::setF(&local_450,0x1a85);
  capnproto_test::capnp::test::TestLists::Builder::getList32(&local_4c8,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4a0,&local_4c8,0);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4a0,0x75bcd15);
  capnproto_test::capnp::test::TestLists::Builder::getList32(&local_518,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Builder::operator[]
            (&local_4f0,&local_518,1);
  capnproto_test::capnp::test::TestLists::Struct32::Builder::setF(&local_4f0,0xdfb38d2);
  capnproto_test::capnp::test::TestLists::Builder::getList64(&local_568,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::operator[]
            (&local_540,&local_568,0);
  capnproto_test::capnp::test::TestLists::Struct64::Builder::setF(&local_540,0x462d53c8abac0);
  capnproto_test::capnp::test::TestLists::Builder::getList64(&local_5b8,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::Struct64,_(capnp::Kind)3>::Builder::operator[]
            (&local_590,&local_5b8,1);
  capnproto_test::capnp::test::TestLists::Struct64::Builder::setF(&local_590,0x85561edaa4b87);
  capnproto_test::capnp::test::TestLists::Builder::getListP(&local_608,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
            (&local_5e0,&local_608,0);
  Text::Reader::Reader((Reader *)&local_618,"foo");
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF(&local_5e0,(Reader)local_618);
  capnproto_test::capnp::test::TestLists::Builder::getListP(&local_668,(Builder *)local_30);
  List<capnproto_test::capnp::test::TestLists::StructP,_(capnp::Kind)3>::Builder::operator[]
            (&local_640,&local_668,1);
  Text::Reader::Reader((Reader *)&l.builder.structDataSize,"bar");
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF
            (&local_640,(Reader)stack0xfffffffffffff988);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList
            ((Builder *)local_6a0,(Builder *)local_30,3);
  local_6bc[0] = 1;
  local_6bc[1] = 2;
  local_6bc[2] = 3;
  local_6b0 = local_6bc;
  local_6a8 = 3;
  value_04._M_len = 3;
  value_04._M_array = local_6b0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_6a0,0,value_04);
  local_6d8[0] = 4;
  local_6d8[1] = 5;
  local_6d0 = local_6d8;
  local_6c8 = 2;
  value_03._M_len = 2;
  value_03._M_array = local_6d0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_6a0,1,value_03);
  l_1.builder.structPointerCount = 0x4ff2;
  l_1.builder.elementSize = 0xbc;
  l_1.builder._39_1_ = 0;
  value_02._M_len = 1;
  value_02._M_array = (iterator)&l_1.builder.structPointerCount;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_6a0,2,value_02);
  capnproto_test::capnp::test::TestLists::Builder::initTextListList
            ((Builder *)local_718,(Builder *)local_30,3);
  Text::Reader::Reader(&local_748,"foo");
  Text::Reader::Reader(&RStack_738,"bar");
  local_728 = &local_748;
  local_720 = 2;
  value_01._M_len = 2;
  value_01._M_array = local_728;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_718,0,value_01);
  Text::Reader::Reader(&local_768,"baz");
  local_758 = &local_768;
  local_750 = 1;
  value_00._M_len = 1;
  value_00._M_array = local_758;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_718,1,value_00);
  Text::Reader::Reader((Reader *)&l_2.builder.structDataSize,"qux");
  Text::Reader::Reader(&RStack_788,"corge");
  local_778 = &l_2.builder.structDataSize;
  local_770 = 2;
  value._M_len = 2;
  value._M_array = (iterator)local_778;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_718,2,value);
  capnproto_test::capnp::test::TestLists::Builder::initStructListList
            ((Builder *)&e.builder.structDataSize,(Builder *)local_30,2);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init((Builder *)local_7e8,(EVP_PKEY_CTX *)&e.builder.structDataSize);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_810,(Builder *)local_7e8,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_810,0x7b);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_838,(Builder *)local_7e8,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_838,0x1c8);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init(&local_860,(EVP_PKEY_CTX *)&e.builder.structDataSize);
  memcpy(local_7e8,&local_860,0x28);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_888,(Builder *)local_7e8,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_888,0x315);
  return;
}

Assistant:

void genericInitListDefaults(Builder builder) {
  auto lists = builder.initLists();

  lists.initList0(2);
  lists.initList1(4);
  lists.initList8(2);
  lists.initList16(2);
  lists.initList32(2);
  lists.initList64(2);
  lists.initListP(2);

  lists.getList0()[0].setF(VOID);
  lists.getList0()[1].setF(VOID);
  lists.getList1()[0].setF(true);
  lists.getList1()[1].setF(false);
  lists.getList1()[2].setF(true);
  lists.getList1()[3].setF(true);
  lists.getList8()[0].setF(123u);
  lists.getList8()[1].setF(45u);
  lists.getList16()[0].setF(12345u);
  lists.getList16()[1].setF(6789u);
  lists.getList32()[0].setF(123456789u);
  lists.getList32()[1].setF(234567890u);
  lists.getList64()[0].setF(1234567890123456u);
  lists.getList64()[1].setF(2345678901234567u);
  lists.getListP()[0].setF("foo");
  lists.getListP()[1].setF("bar");

  {
    auto l = lists.initInt32ListList(3);
    l.set(0, {1, 2, 3});
    l.set(1, {4, 5});
    l.set(2, {12341234});
  }

  {
    auto l = lists.initTextListList(3);
    l.set(0, {"foo", "bar"});
    l.set(1, {"baz"});
    l.set(2, {"qux", "corge"});
  }

  {
    auto l = lists.initStructListList(2);
    auto e = l.init(0, 2);
    e[0].setInt32Field(123);
    e[1].setInt32Field(456);
    e = l.init(1, 1);
    e[0].setInt32Field(789);
  }
}